

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.cpp
# Opt level: O0

string * __thiscall
cali::Variant::to_string_abi_cxx11_(string *__return_storage_ptr__,Variant *this)

{
  bool bVar1;
  cali_attr_type cVar2;
  size_t sVar3;
  uchar *__last;
  ostream *poVar4;
  uint64_t uVar5;
  char *pcVar6;
  void *pvVar7;
  void *pvVar8;
  string local_5a0 [32];
  ostringstream local_580 [8];
  ostringstream os_2;
  string local_408;
  string local_3e8 [32];
  ostringstream local_3c8 [8];
  ostringstream os_1;
  size_t len;
  char *str;
  string local_220;
  string local_200 [32];
  uchar local_1e0 [19];
  char local_1cd;
  int local_1cc;
  ostream_iterator<unsigned_int,_char,_std::char_traits<char>_> local_1c8;
  ostringstream local_1b8 [8];
  ostringstream os;
  void *ptr;
  size_t size;
  Variant *this_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cVar2 = type(this);
  switch(cVar2) {
  case CALI_TYPE_INV:
    break;
  case CALI_TYPE_USR:
    sVar3 = Variant::size(this);
    __last = (uchar *)data(this);
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar4 = (ostream *)std::ostream::operator<<(local_1b8,std::hex);
    local_1cc = (int)std::setw(2);
    poVar4 = std::operator<<(poVar4,(_Setw)local_1cc);
    local_1cd = (char)std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,local_1cd);
    std::ostream_iterator<unsigned_int,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_1c8,poVar4,":");
    std::copy<unsigned_char_const*,std::ostream_iterator<unsigned_int,char,std::char_traits<char>>>
              (local_1e0,__last,
               (ostream_iterator<unsigned_int,_char,_std::char_traits<char>_> *)(__last + sVar3));
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_200);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
    break;
  case CALI_TYPE_INT:
    std::__cxx11::to_string(&local_220,(this->m_v).value.v_int);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    break;
  case CALI_TYPE_UINT:
    std::__cxx11::to_string((string *)&str,(this->m_v).value.v_uint);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&str);
    std::__cxx11::string::~string((string *)&str);
    break;
  case CALI_TYPE_STRING:
    pvVar7 = data(this);
    Variant::size(this);
    std::__cxx11::string::assign((char *)__return_storage_ptr__,(ulong)pvVar7);
    break;
  case CALI_TYPE_ADDR:
    std::__cxx11::ostringstream::ostringstream(local_3c8);
    pvVar7 = (void *)std::ostream::operator<<(local_3c8,std::hex);
    uVar5 = to_uint(this,(bool *)0x0);
    std::ostream::operator<<(pvVar7,uVar5);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_3e8);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::ostringstream::~ostringstream(local_3c8);
    break;
  case CALI_TYPE_DOUBLE:
    std::__cxx11::to_string(&local_408,(this->m_v).value.v_double);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    break;
  case CALI_TYPE_BOOL:
    bVar1 = to_bool(this,(bool *)0x0);
    pcVar6 = "false";
    if (bVar1) {
      pcVar6 = "true";
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar6);
    break;
  case CALI_TYPE_TYPE:
    cVar2 = to_attr_type(this,(bool *)0x0);
    pcVar6 = cali_type2string(cVar2);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar6);
    break;
  case CALI_TYPE_PTR:
    std::__cxx11::ostringstream::ostringstream(local_580);
    pvVar7 = (void *)std::ostream::operator<<(local_580,std::hex);
    pvVar8 = data(this);
    std::ostream::operator<<(pvVar7,(ulong)pvVar8);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_5a0);
    std::__cxx11::string::~string(local_5a0);
    std::__cxx11::ostringstream::~ostringstream(local_580);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Variant::to_string() const
{
    std::string ret;

    switch (this->type()) {
    case CALI_TYPE_INV:
        break;
    case CALI_TYPE_USR:
        {
            size_t      size = this->size();
            const void* ptr  = data();

            std::ostringstream os;

            std::copy(
                static_cast<const unsigned char*>(ptr),
                static_cast<const unsigned char*>(ptr) + size,
                std::ostream_iterator<unsigned>(os << std::hex << std::setw(2) << std::setfill('0'), ":")
            );

            ret = os.str();
        }
        break;
    case CALI_TYPE_INT:
        ret = std::to_string(m_v.value.v_int);
        break;
    case CALI_TYPE_UINT:
        ret = std::to_string(m_v.value.v_uint);
        break;
    case CALI_TYPE_STRING:
        {
            const char* str = static_cast<const char*>(data());
            std::size_t len = size();

            if (len && str[len - 1] == 0)
                --len;

            ret.assign(str, len);
        }
        break;
    case CALI_TYPE_ADDR:
        {
            std::ostringstream os;
            os << std::hex << to_uint();
            ret = os.str();
        }
        break;
    case CALI_TYPE_DOUBLE:
        ret = std::to_string(m_v.value.v_double);
        break;
    case CALI_TYPE_BOOL:
        ret = to_bool() ? "true" : "false";
        break;
    case CALI_TYPE_TYPE:
        ret = cali_type2string(to_attr_type());
        break;
    case CALI_TYPE_PTR:
        {
            std::ostringstream os;
            os << std::hex << reinterpret_cast<uint64_t>(data());
            ret = os.str();
        }
    }

    return ret;
}